

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeShaderBuiltinVarTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::compute::anon_unknown_0::ComputeBuiltinVarCase::createInstance
          (ComputeBuiltinVarCase *this,Context *context)

{
  DataType DVar1;
  pointer pSVar2;
  deUint32 dVar3;
  TestInstance *pTVar4;
  VkDevice pVVar5;
  Context *pCVar6;
  VkQueue pVVar7;
  Context *pCVar8;
  long lVar9;
  pointer __args;
  SubCase *__cur;
  
  pCVar8 = context;
  pTVar4 = (TestInstance *)operator_new(0x58);
  DVar1 = this->m_varType;
  pTVar4->m_context = context;
  pTVar4->_vptr_TestInstance = (_func_int **)&PTR__ComputeBuiltinVarInstance_00bd8cf0;
  pVVar5 = Context::getDevice(context);
  pTVar4[1]._vptr_TestInstance = (_func_int **)pVVar5;
  pCVar6 = (Context *)Context::getDeviceInterface(context);
  pTVar4[1].m_context = pCVar6;
  pVVar7 = Context::getUniversalQueue(context);
  pTVar4[2]._vptr_TestInstance = (_func_int **)pVVar7;
  dVar3 = Context::getUniversalQueueFamilyIndex(context);
  *(deUint32 *)&pTVar4[2].m_context = dVar3;
  lVar9 = (long)(this->m_subCases).
                super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_subCases).
                super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
                ._M_impl.super__Vector_impl_data._M_start;
  pTVar4[3]._vptr_TestInstance = (_func_int **)0x0;
  pTVar4[3].m_context = (Context *)0x0;
  pTVar4[4]._vptr_TestInstance = (_func_int **)0x0;
  pCVar8 = (Context *)
           std::
           _Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
           ::_M_allocate((_Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
                          *)(lVar9 / 0x18),(size_t)pCVar8);
  pTVar4[3]._vptr_TestInstance = (_func_int **)pCVar8;
  pTVar4[3].m_context = pCVar8;
  pTVar4[4]._vptr_TestInstance = (_func_int **)(lVar9 + (long)pCVar8);
  pSVar2 = (this->m_subCases).
           super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__args = (this->m_subCases).
                super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
                ._M_impl.super__Vector_impl_data._M_start; __args != pSVar2; __args = __args + 1) {
    std::
    _Construct<vkt::compute::(anonymous_namespace)::SubCase,vkt::compute::(anonymous_namespace)::SubCase_const&>
              ((SubCase *)pCVar8,__args);
    pCVar8 = (Context *)&pCVar8->m_device;
  }
  pTVar4[3].m_context = pCVar8;
  pTVar4[4].m_context = (Context *)this;
  *(undefined4 *)&pTVar4[5]._vptr_TestInstance = 0;
  *(DataType *)((long)&pTVar4[5]._vptr_TestInstance + 4) = DVar1;
  return pTVar4;
}

Assistant:

TestInstance*			createInstance			(Context& context) const
	{
		return new ComputeBuiltinVarInstance(context, m_subCases, m_varType, this);
	}